

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ALSADriver.cpp
# Opt level: O0

uint __thiscall ALSAMidiDriver::getSourceAddr(ALSAMidiDriver *this,snd_seq_event_t *seq_event)

{
  snd_seq_addr_t local_1a;
  snd_seq_addr addr;
  snd_seq_event_t *seq_event_local;
  ALSAMidiDriver *this_local;
  
  if ((seq_event->type == 'B') || (seq_event->type == 'C')) {
    local_1a = (seq_event->data).addr;
  }
  else {
    local_1a = seq_event->source;
  }
  return (uint)CONCAT11(local_1a.client,local_1a.port);
}

Assistant:

unsigned int ALSAMidiDriver::getSourceAddr(snd_seq_event_t *seq_event) {
	snd_seq_addr addr;
	if (seq_event->type == SND_SEQ_EVENT_PORT_SUBSCRIBED || seq_event->type == SND_SEQ_EVENT_PORT_UNSUBSCRIBED)
		addr = seq_event->data.connect.sender;
	else
		addr = seq_event->source;
	return (addr.client << 8) | addr.port;
}